

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_manager.cpp
# Opt level: O1

void miniros::getPid(XmlRpcValue *params,XmlRpcValue *result)

{
  __pid_t response;
  XmlRpcValue XStack_48;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"");
  response = getpid();
  xmlrpc::responseInt((xmlrpc *)&XStack_48,1,&local_38,response);
  XmlRpc::XmlRpcValue::operator=(result,&XStack_48);
  XmlRpc::XmlRpcValue::invalidate(&XStack_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void getPid(const XmlRpcValue& params, XmlRpcValue& result)
{
  (void)params;
  result = xmlrpc::responseInt(1, "", (int)getpid());
}